

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall
gmath::PinholeCamera::projectPointLocal(PinholeCamera *this,Vector2d *p,Vector3d *Pc)

{
  Distortion *pDVar1;
  Vector3d P;
  SVector<double,_3> local_28;
  
  SVector<double,_3>::operator/(&local_28,Pc,Pc->v[2]);
  pDVar1 = this->dist;
  if (pDVar1 != (Distortion *)0x0) {
    (*pDVar1->_vptr_Distortion[6])(local_28.v[0],local_28.v[1],pDVar1,&local_28);
  }
  *(double *)p = (this->A).v[0][0] * local_28.v[0] + (this->A).v[0][1] * local_28.v[1] +
                 (this->A).v[0][2];
  *(double *)(p + 8) = local_28.v[1] * (this->A).v[1][1] + (this->A).v[1][2];
  return;
}

Assistant:

void PinholeCamera::projectPointLocal(Vector2d &p, const Vector3d &Pc) const
{
  // apply lens distortion

  Vector3d P=Pc/Pc[2];

  if (dist != 0)
  {
    const double x=P[0];
    const double y=P[1];
    dist->transform(P[0], P[1], x, y);
  }

  // apply camera matrix

  p[0]=A(0, 0)*P[0]+A(0, 1)*P[1]+A(0, 2);
  p[1]=A(1, 1)*P[1]+A(1, 2);
}